

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O1

void __thiscall ON_Layer::DeletePerViewportPlotColor(ON_Layer *this,ON_UUID *viewport_id)

{
  ON__UINT8 *pOVar1;
  long lVar2;
  bool bVar3;
  uint uVar4;
  ON__LayerExtensions *pOVar5;
  ON__LayerPerViewSettings *this_00;
  long lVar6;
  int i;
  undefined1 in_R9B;
  ON_UUID viewport_id_00;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_4c;
  ON_Layer *local_48;
  ON__UINT8 *local_40;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_34;
  
  bVar3 = ON_UuidIsNil(viewport_id);
  pOVar1 = &this->m_extension_bits;
  if (bVar3) {
    pOVar5 = ON__LayerExtensions::LayerExtensions(this,pOVar1,false);
    if (pOVar5 != (ON__LayerExtensions *)0x0) {
      i = (pOVar5->m_vp_settings).m_count;
      lVar6 = (long)i;
      local_48 = this;
      local_40 = pOVar1;
      if (lVar6 != 0) {
        lVar2 = lVar6 * 0x28;
        do {
          i = i + -1;
          ON_Color::ON_Color((ON_Color *)&local_4c,0xffffffff);
          *(anon_union_4_2_6147a14e_for_ON_Color_15 *)
           ((long)&((ON_Color *)(&(pOVar5->m_vp_settings).m_a[-1].m_viewport_id + 1))[1].field_0 +
           lVar2) = local_4c;
          uVar4 = ON__LayerPerViewSettings::SettingsMask
                            ((ON__LayerPerViewSettings *)
                             ((pOVar5->m_vp_settings).m_a[-1].m_viewport_id.Data4 + lVar2 + -8));
          if (uVar4 == 0) {
            ON_SimpleArray<ON__LayerPerViewSettings>::Remove(&pOVar5->m_vp_settings,i);
          }
          lVar6 = lVar6 + -1;
          lVar2 = lVar2 + -0x28;
        } while (lVar6 != 0);
      }
      bVar3 = ON__LayerExtensions::IsEmpty(pOVar5);
      pOVar1 = local_40;
      if (bVar3) {
        pOVar5 = ON__LayerExtensions::LayerExtensions(local_48,local_40,false);
        if (pOVar5 != (ON__LayerExtensions *)0x0) {
          (*(pOVar5->super_ON_UserData).super_ON_Object._vptr_ON_Object[4])(pOVar5);
          *pOVar1 = *pOVar1 | 1;
        }
      }
    }
  }
  else {
    viewport_id_00.Data4[0] = '\0';
    viewport_id_00.Data4[1] = '\0';
    viewport_id_00.Data4[2] = '\0';
    viewport_id_00.Data4[3] = '\0';
    viewport_id_00.Data4[4] = '\0';
    viewport_id_00.Data4[5] = '\0';
    viewport_id_00.Data4[6] = '\0';
    viewport_id_00.Data4[7] = '\0';
    viewport_id_00._0_8_ = *(ulong *)viewport_id->Data4;
    this_00 = ON__LayerExtensions::ViewportSettings
                        ((ON__LayerExtensions *)this,(ON_Layer *)pOVar1,*(uchar **)viewport_id,
                         viewport_id_00,(bool)in_R9B);
    if (this_00 != (ON__LayerPerViewSettings *)0x0) {
      ON_Color::ON_Color((ON_Color *)&local_34,0xffffffff);
      (this_00->m_plot_color).field_0 = local_34;
      uVar4 = ON__LayerPerViewSettings::SettingsMask(this_00);
      if (uVar4 == 0) {
        ON__LayerExtensions::DeleteViewportSettings(this,pOVar1,this_00);
      }
    }
  }
  return;
}

Assistant:

void ON_Layer::DeletePerViewportPlotColor( const ON_UUID& viewport_id )
{
  if ( ON_UuidIsNil(viewport_id) )
  {
    ON__LayerExtensions* ud = ON__LayerExtensions::LayerExtensions(*this,&m_extension_bits,false);
    if ( 0 != ud )
    {
      for ( int i = ud->m_vp_settings.Count(); i--; /*empty iterator*/ )
      {
        ud->m_vp_settings[i].m_plot_color = ON_UNSET_COLOR;
        if ( 0 == ud->m_vp_settings[i].SettingsMask() )
          ud->m_vp_settings.Remove(i);
      }
      if ( ud->IsEmpty() )
      {
        ON__LayerExtensions::DeleteViewportSettings( *this, &m_extension_bits, 0 );
        ud = 0;
      }
    }
  }
  else
  {
    ON__LayerPerViewSettings* vp_settings = ON__LayerExtensions::ViewportSettings( *this, &m_extension_bits, viewport_id, false );
    if (vp_settings) 
    {
      vp_settings->m_plot_color = ON_UNSET_COLOR;
      if ( 0 == vp_settings->SettingsMask() )
        ON__LayerExtensions::DeleteViewportSettings(*this,&m_extension_bits,vp_settings);
    }
  }
}